

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O2

Result wallet::feebumper::CreateRateBumpTransaction
                 (CWallet *wallet,uint256 *txid,CCoinControl *coin_control,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,CAmount *old_fee,
                 CAmount *new_fee,CMutableTransaction *mtx,bool require_mine,
                 vector<CTxOut,_std::allocator<CTxOut>_> *outputs,
                 optional<unsigned_int> original_change_index)

{
  key_type *pkVar1;
  vector<CTxIn,_std::allocator<CTxIn>_> *this;
  undefined8 *puVar2;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  string original_05;
  string original_06;
  string original_07;
  string original_08;
  string original_09;
  string original_10;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bool bVar3;
  isminetype iVar4;
  Result RVar5;
  int iVar6;
  int iVar7;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var8;
  Chain *pCVar9;
  CTxOut *txout;
  PreselectedInput *this_00;
  const_reference __k;
  mapped_type *pmVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  const_reference txout_00;
  int64_t iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CAmount CVar17;
  undefined4 extraout_var_02;
  CAmount CVar18;
  T *pTVar19;
  undefined8 *puVar20;
  long *plVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint extraout_EDX;
  uint32_t num_bytes;
  CTxIn *txin;
  key_type *pkVar22;
  long lVar23;
  CWalletTx *wtx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  CTxIn *txin_1;
  ulong uVar24;
  value_type *__x;
  ulong __n;
  long n;
  vector<CTxOut,_std::allocator<CTxOut>_> *__x_00;
  long in_FS_OFFSET;
  TxSize TVar25;
  CWallet *this_01;
  CWallet *wallet_00;
  undefined8 in_stack_fffffffffffff848;
  undefined8 in_stack_fffffffffffff850;
  long lVar26;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> recipients;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  allocator<char> local_721;
  CFeeRate incrementalRelayFee;
  vector<COutPoint,_std::allocator<COutPoint>_> reused_inputs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  bilingual_str local_6e8;
  string local_6a8 [32];
  SignatureWeights weights;
  vector<CTxOut,_std::allocator<CTxOut>_> local_670;
  string local_648 [32];
  bilingual_str local_628;
  bilingual_str local_5e8;
  Result<wallet::CreatedTransactionResult> res;
  string local_4f8 [32];
  SignatureWeightChecker size_checker;
  PrecomputedTransactionData txdata;
  string local_358;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  string local_308 [32];
  string local_2e8 [32];
  CCoinControl new_coin_control;
  string local_f8 [32];
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar24 = (ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20;
  if (((outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_start ==
       (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_finish) || ((uVar24 & 1) == 0)) {
    CCoinControl::CCoinControl(&new_coin_control,coin_control);
    this_01 = wallet;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock2,&wallet->cs_wallet,"wallet.cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/feebumper.cpp"
               ,0xb1,false);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::clear(errors);
    _Var8._M_cur = (__node_type *)
                   _GLOBAL__N_1::std::
                   _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&wallet->mapWallet,txid);
    if (_Var8._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_2e8,"Invalid or non-wallet transaction id",(allocator<char> *)&res);
      original_01._M_string_length = (size_type)this_01;
      original_01._M_dataplus._M_p = (pointer)errors;
      original_01.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
      original_01.field_2._8_8_ = in_stack_fffffffffffff850;
      Untranslated((bilingual_str *)&txdata,original_01);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (errors,(bilingual_str *)&txdata);
      RVar5 = INVALID_ADDRESS_OR_KEY;
      bilingual_str::~bilingual_str((bilingual_str *)&txdata);
      std::__cxx11::string::~string(local_2e8);
    }
    else {
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000028;
      if ((uVar24 & 1) == 0) {
        puVar20 = *(undefined8 **)((long)_Var8._M_cur + 0x1c0);
      }
      else {
        puVar20 = *(undefined8 **)((long)_Var8._M_cur + 0x1c0);
        if ((ulong)((long)(puVar20[4] - puVar20[3]) / 0x28) <=
            ((ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0xffffffff)) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_308,"Change position is out of range",(allocator<char> *)&res);
          original_00._M_string_length = (size_type)this_01;
          original_00._M_dataplus._M_p = (pointer)errors;
          original_00.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
          original_00.field_2._8_8_ = in_stack_fffffffffffff850;
          Untranslated((bilingual_str *)&txdata,original_00);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)&txdata);
          bilingual_str::~bilingual_str((bilingual_str *)&txdata);
          std::__cxx11::string::~string(local_308);
          RVar5 = INVALID_PARAMETER;
          goto LAB_004a53bb;
        }
      }
      wtx = (CWalletTx *)((long)_Var8._M_cur + 0x28);
      coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &coins._M_t._M_impl.super__Rb_tree_header._M_header;
      coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pkVar1 = (key_type *)puVar20[1];
      coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pkVar22 = (key_type *)*puVar20; pkVar22 != pkVar1; pkVar22 = (key_type *)&pkVar22[2].n) {
        std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[](&coins,pkVar22);
      }
      pCVar9 = CWallet::chain(this_01);
      (*pCVar9->_vptr_Chain[0xf])(pCVar9);
      puVar20 = *(undefined8 **)
                 ((long)&((_Var8._M_cur)->
                         super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                         super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                         _M_storage._M_storage + 0x1b8);
      pkVar1 = (key_type *)puVar20[1];
      lVar26 = 0;
      for (pkVar22 = (key_type *)*puVar20; pkVar22 != pkVar1; pkVar22 = (key_type *)&pkVar22[2].n) {
        txout = &std::
                 map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 ::at(&coins,pkVar22)->out;
        if (txout->nValue == -1) {
          base_blob<256u>::GetHex_abi_cxx11_((string *)&res,(base_blob<256u> *)pkVar22);
          tinyformat::format<std::__cxx11::string,unsigned_int>
                    (&local_358,(tinyformat *)"%s:%u is already spent",(char *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pkVar22->n,(uint *)args_1);
          original_02._M_string_length = (size_type)this_01;
          original_02._M_dataplus._M_p = (pointer)errors;
          original_02.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
          original_02.field_2._8_8_ = in_stack_fffffffffffff850;
          Untranslated((bilingual_str *)&txdata,original_02);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)&txdata);
          bilingual_str::~bilingual_str((bilingual_str *)&txdata);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&res);
          RVar5 = MISC_ERROR;
          goto LAB_004a53a1;
        }
        this_00 = CCoinControl::Select(&new_coin_control,pkVar22);
        iVar4 = CWallet::IsMine(this_01,pkVar22);
        if (iVar4 == ISMINE_NO) {
          PreselectedInput::SetTxOut(this_00,txout);
        }
        lVar23 = txout->nValue;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&spent_outputs,txout);
        lVar26 = lVar26 + lVar23;
      }
      uVar15 = 0;
      memset(&txdata,0,0x102);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      txdata._281_8_ = 0;
      PrecomputedTransactionData::Init<CTransaction>
                (&txdata,*(CTransaction **)
                          ((long)&((_Var8._M_cur)->
                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                  ._M_storage._M_storage + 0x1b8),&spent_outputs,true);
      while( true ) {
        this = *(vector<CTxIn,_std::allocator<CTxIn>_> **)
                ((long)&((_Var8._M_cur)->
                        super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                        super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                        _M_storage._M_storage + 0x1b8);
        if ((ulong)(((long)(this->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= uVar15) break;
        __k = std::vector<CTxIn,_std::allocator<CTxIn>_>::at(this,uVar15);
        pmVar10 = std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::at(&coins,&__k->prevout);
        bVar3 = CCoinControl::IsExternalSelected(&new_coin_control,&__k->prevout);
        if (bVar3) {
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
               &::TX_NO_WITNESS;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
               __k;
          sVar11 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                             ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)&res);
          size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
          _vptr_BaseSignatureChecker = (_func_int **)&::TX_WITH_WITNESS;
          size_checker.super_DeferringSignatureChecker.m_checker = (BaseSignatureChecker *)__k;
          sVar12 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                             ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)&size_checker);
          sVar13 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                             (&(__k->scriptWitness).stack);
          weights.m_sigs_count = 0;
          weights.m_sigs_weight = 0;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
               *(undefined8 *)
                ((long)&((_Var8._M_cur)->
                        super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                        super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                        _M_storage._M_storage + 0x1b8);
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
               &PTR_CheckECDSASignature_00a163d8;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._20_4_
               = (int)uVar15;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_4_
               = 1;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_
               = (pmVar10->out).nValue;
          res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._32_8_
               = &txdata;
          size_checker.super_DeferringSignatureChecker.m_checker = (BaseSignatureChecker *)&res;
          size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
          _vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_00a19450;
          size_checker.m_weights = &weights;
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &size_checker;
          VerifyScript(&__k->scriptSig,&(pmVar10->out).scriptPubKey,&__k->scriptWitness,0x1fffdf,
                       (BaseSignatureChecker *)args_1,(ScriptError *)0x0);
          CCoinControl::SetInputWeight
                    (&new_coin_control,&__k->prevout,
                     ((sVar12 + sVar11 * 3 + sVar13) - weights.m_sigs_weight) +
                     (long)weights.m_sigs_count * 0x48);
        }
        uVar15 = (ulong)((int)uVar15 + 1);
      }
      RVar5 = PreconditionChecks(this_01,wtx,require_mine,errors);
      if (RVar5 == OK) {
        lVar23 = *(long *)((long)&((_Var8._M_cur)->
                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                  ._M_storage._M_storage + 0x1b8);
        lVar14 = 0;
        for (plVar21 = *(long **)(lVar23 + 0x18); plVar21 != *(long **)(lVar23 + 0x20);
            plVar21 = plVar21 + 5) {
          lVar14 = lVar14 + *plVar21;
        }
        *old_fee = lVar26 - lVar14;
        recipients.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        recipients.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        recipients.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x_00 = (vector<CTxOut,_std::allocator<CTxOut>_> *)(lVar23 + 0x18);
        if ((outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __x_00 = outputs;
        }
        uVar15 = (ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>.
                        _M_payload.super__Optional_payload_base<unsigned_int> & 0xffffffff;
        lVar23 = 0;
        for (__n = 0; __n < (ulong)(((long)(__x_00->
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(__x_00->
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>).
                                          _M_impl.super__Vector_impl_data._M_start) / 0x28);
            __n = __n + 1) {
          txout_00 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(__x_00,__n);
          size_checker.m_weights = (SignatureWeights *)0x0;
          size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
          _vptr_BaseSignatureChecker = (_func_int **)0x0;
          size_checker.super_DeferringSignatureChecker.m_checker = (BaseSignatureChecker *)0x0;
          ExtractDestination(&txout_00->scriptPubKey,(CTxDestination *)&size_checker);
          if ((uVar24 & 1) == 0) {
            bVar3 = OutputIsChange(this_01,txout_00);
            if (bVar3) goto LAB_004a4a74;
LAB_004a4a97:
            _GLOBAL__N_1::std::__detail::__variant::
            _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&res,(_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                       *)&size_checker);
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _80_8_ = txout_00->nValue;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _88_1_ = 0;
            std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::push_back
                      (&recipients,(value_type *)&res);
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&res);
          }
          else {
            if (uVar15 != __n) goto LAB_004a4a97;
LAB_004a4a74:
            std::__detail::__variant::
            _Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::operator=((_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&new_coin_control,
                        (_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&size_checker);
          }
          lVar23 = lVar23 + txout_00->nValue;
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&size_checker);
        }
        if (recipients.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            recipients.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (new_coin_control.destChange.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_index != '\0') {
            _GLOBAL__N_1::std::__detail::__variant::
            _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&res,(_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                       *)&new_coin_control);
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _88_1_ = 1;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _80_8_ = lVar23;
            std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::
            emplace_back<wallet::CRecipient>(&recipients,(CRecipient *)&res);
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&res);
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _16_8_ = 0;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _24_8_ = 0;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_
                 = 0;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_
                 = 0;
            std::
            variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
            ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                         *)&new_coin_control,(CNoDestination *)&res);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&res);
            goto LAB_004a4b60;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    (local_4f8,
                     "Unable to create transaction. Transaction must have at least one recipient",
                     (allocator<char> *)&size_checker);
          original_06._M_string_length = (size_type)this_01;
          original_06._M_dataplus._M_p = (pointer)errors;
          original_06.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
          original_06.field_2._8_8_ = uVar15;
          Untranslated((bilingual_str *)&res,original_06);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)&res);
          bilingual_str::~bilingual_str((bilingual_str *)&res);
          std::__cxx11::string::~string(local_4f8);
          RVar5 = INVALID_PARAMETER;
        }
        else {
LAB_004a4b60:
          if ((coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged == true) {
            CMutableTransaction::CMutableTransaction
                      ((CMutableTransaction *)&weights,
                       *(CTransaction **)
                        ((long)&((_Var8._M_cur)->
                                super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                ._M_storage._M_storage + 0x1b8));
            iVar16 = weights.m_sigs_weight;
            wallet_00 = this_01;
            plVar21 = old_fee;
            for (lVar23 = CONCAT44(weights._4_4_,weights.m_sigs_count); lVar23 != iVar16;
                lVar23 = lVar23 + 0x68) {
              CScript::clear((CScript *)(lVar23 + 0x28));
              CScriptWitness::SetNull((CScriptWitness *)(lVar23 + 0x50));
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(&local_670,__x_00);
            CTransaction::CTransaction((CTransaction *)&res,(CMutableTransaction *)&weights);
            this_01 = wallet_00;
            old_fee = plVar21;
            TVar25 = CalculateMaximumSignedTxSize((CTransaction *)&res,wallet_00,&new_coin_control);
            CTransaction::~CTransaction((CTransaction *)&res);
            lVar23 = *plVar21;
            pCVar9 = CWallet::chain(wallet_00);
            iVar6 = (*pCVar9->_vptr_Chain[0x1d])(pCVar9);
            if ((long)new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>.
                      _M_payload.super__Optional_payload_base<CFeeRate>._M_payload <
                CONCAT44(extraout_var_00,iVar6)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6e8,
                         "New fee rate (%s) is lower than the minimum fee rate (%s) to get into the mempool -- "
                         ,(allocator<char> *)&local_98);
              original_03._M_string_length = (size_type)this_01;
              original_03._M_dataplus._M_p = (pointer)errors;
              original_03.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
              original_03.field_2._8_8_ = uVar15;
              Untranslated((bilingual_str *)&size_checker,original_03);
              FormatMoney_abi_cxx11_
                        ((string *)(local_78 + 0x20),
                         (CAmount)new_coin_control.m_feerate.
                                  super__Optional_base<CFeeRate,_true,_true>._M_payload.
                                  super__Optional_payload_base<CFeeRate>._M_payload);
              FormatMoney_abi_cxx11_((string *)local_78,CONCAT44(extraout_var_00,iVar6));
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        ((bilingual_str *)&res,(tinyformat *)&size_checker,
                         (bilingual_str *)(local_78 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,args_1);
              std::vector<bilingual_str,_std::allocator<bilingual_str>_>::
              emplace_back<bilingual_str>(errors,(bilingual_str *)&res);
              bilingual_str::~bilingual_str((bilingual_str *)&res);
              std::__cxx11::string::~string((string *)local_78);
              std::__cxx11::string::~string((string *)(local_78 + 0x20));
              bilingual_str::~bilingual_str((bilingual_str *)&size_checker);
              std::__cxx11::string::~string((string *)&local_6e8);
              RVar5 = WALLET_ERROR;
            }
            else {
              reused_inputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              reused_inputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              reused_inputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              std::vector<COutPoint,_std::allocator<COutPoint>_>::reserve
                        (&reused_inputs,
                         (weights.m_sigs_weight - CONCAT44(weights._4_4_,weights.m_sigs_count)) /
                         0x68);
              iVar16 = weights.m_sigs_weight;
              for (__x = (value_type *)CONCAT44(weights._4_4_,weights.m_sigs_count);
                  __x != (value_type *)iVar16; __x = (value_type *)&__x[2].n) {
                std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back(&reused_inputs,__x);
              }
              pCVar9 = CWallet::chain(this_01);
              iVar6 = (*pCVar9->_vptr_Chain[0x18])
                                (pCVar9,&reused_inputs,&new_coin_control.m_feerate);
              if ((extraout_EDX & 1) == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6e8,
                           "Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions."
                           ,(allocator<char> *)(local_78 + 0x20));
                original_04._M_string_length = (size_type)this_01;
                original_04._M_dataplus._M_p = (pointer)errors;
                original_04.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
                original_04.field_2._8_8_ = uVar15;
                Untranslated((bilingual_str *)&size_checker,original_04);
                tinyformat::format<>((bilingual_str *)&res,(bilingual_str *)&size_checker);
                std::vector<bilingual_str,_std::allocator<bilingual_str>_>::
                emplace_back<bilingual_str>(errors,(bilingual_str *)&res);
                bilingual_str::~bilingual_str((bilingual_str *)&res);
                bilingual_str::~bilingual_str((bilingual_str *)&size_checker);
                std::__cxx11::string::~string((string *)&local_6e8);
              }
              num_bytes = (uint32_t)TVar25.vsize;
              CVar17 = CFeeRate::GetFee((CFeeRate *)&new_coin_control.m_feerate,num_bytes);
              if ((extraout_EDX & 1) == 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
                goto LAB_004a5ab4;
              }
              pCVar9 = CWallet::chain(this_01);
              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pCVar9->_vptr_Chain;
              iVar7 = (**(code **)((long)&args[7].field_2 + 8))(pCVar9);
              incrementalRelayFee.nSatoshisPerK = CONCAT44(extraout_var_02,iVar7);
              CVar18 = CFeeRate::GetFee(&incrementalRelayFee,num_bytes);
              n = CVar17 + CONCAT44(extraout_var_01,iVar6);
              lVar14 = CVar18 + lVar23;
              if (n < lVar14) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(local_78 + 0x20),
                           "Insufficient total fee %s, must be at least %s (oldFee %s + incrementalFee %s)"
                           ,&local_721);
                original_05._M_string_length = (size_type)this_01;
                original_05._M_dataplus._M_p = (pointer)errors;
                original_05.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
                original_05.field_2._8_8_ = uVar15;
                Untranslated((bilingual_str *)&size_checker,original_05);
                FormatMoney_abi_cxx11_((string *)local_78,n);
                FormatMoney_abi_cxx11_(&local_98,lVar14);
                FormatMoney_abi_cxx11_(&local_b8,lVar23);
                CVar17 = CFeeRate::GetFee(&incrementalRelayFee,num_bytes);
                FormatMoney_abi_cxx11_(&local_d8,CVar17);
                tinyformat::
                format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((bilingual_str *)&res,(tinyformat *)&size_checker,
                           (bilingual_str *)local_78,&local_98,&local_b8,&local_d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           errors);
                std::vector<bilingual_str,_std::allocator<bilingual_str>_>::
                emplace_back<bilingual_str>(errors,(bilingual_str *)&res);
                bilingual_str::~bilingual_str((bilingual_str *)&res);
                std::__cxx11::string::~string((string *)&local_d8);
                std::__cxx11::string::~string((string *)&local_b8);
                std::__cxx11::string::~string((string *)&local_98);
LAB_004a511f:
                std::__cxx11::string::~string((string *)local_78);
                bilingual_str::~bilingual_str((bilingual_str *)&size_checker);
                std::__cxx11::string::~string((string *)(local_78 + 0x20));
                RVar5 = INVALID_PARAMETER;
              }
              else {
                CVar17 = GetRequiredFee(this_01,num_bytes);
                if (n < CVar17) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_78 + 0x20),
                             "Insufficient total fee (cannot be less than required fee %s)",
                             (allocator<char> *)&local_98);
                  original_07._M_string_length = (size_type)this_01;
                  original_07._M_dataplus._M_p = (pointer)errors;
                  original_07.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
                  original_07.field_2._8_8_ = uVar15;
                  Untranslated((bilingual_str *)&size_checker,original_07);
                  FormatMoney_abi_cxx11_((string *)local_78,CVar17);
                  tinyformat::format<std::__cxx11::string>
                            ((bilingual_str *)&res,(tinyformat *)&size_checker,
                             (bilingual_str *)local_78,args);
                  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::
                  emplace_back<bilingual_str>(errors,(bilingual_str *)&res);
                  bilingual_str::~bilingual_str((bilingual_str *)&res);
                  goto LAB_004a511f;
                }
                CVar17 = this_01->m_default_max_tx_fee;
                RVar5 = OK;
                if (CVar17 < n) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_78 + 0x20),
                             "Specified or calculated fee %s is too high (cannot be higher than -maxtxfee %s)"
                             ,(allocator<char> *)&local_b8);
                  original_10._M_string_length = (size_type)this_01;
                  original_10._M_dataplus._M_p = (pointer)errors;
                  original_10.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
                  original_10.field_2._8_8_ = uVar15;
                  Untranslated((bilingual_str *)&size_checker,original_10);
                  FormatMoney_abi_cxx11_((string *)local_78,n);
                  FormatMoney_abi_cxx11_(&local_98,CVar17);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((bilingual_str *)&res,(tinyformat *)&size_checker,
                             (bilingual_str *)local_78,&local_98,args_1);
                  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::
                  emplace_back<bilingual_str>(errors,(bilingual_str *)&res);
                  bilingual_str::~bilingual_str((bilingual_str *)&res);
                  std::__cxx11::string::~string((string *)&local_98);
                  std::__cxx11::string::~string((string *)local_78);
                  bilingual_str::~bilingual_str((bilingual_str *)&size_checker);
                  std::__cxx11::string::~string((string *)(local_78 + 0x20));
                  RVar5 = WALLET_ERROR;
                }
              }
              std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                        (&reused_inputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
            }
            CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&weights);
            if (RVar5 != OK) goto LAB_004a538a;
          }
          else {
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_
                 = *old_fee;
            iVar16 = GetVirtualTransactionSize
                               (*(CTransaction **)
                                 ((long)&((_Var8._M_cur)->
                                         super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                         ._M_storage._M_storage + 0x1b8),0,0);
            CFeeRate::CFeeRate((CFeeRate *)&size_checker,(CAmount *)&res,(uint32_t)iVar16);
            size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
            _vptr_BaseSignatureChecker =
                 size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
                 _vptr_BaseSignatureChecker + 1;
            pCVar9 = CWallet::chain(this_01);
            iVar6 = (*pCVar9->_vptr_Chain[0x1f])(pCVar9);
            lVar23 = 5000;
            if (5000 < CONCAT44(extraout_var,iVar6)) {
              lVar23 = CONCAT44(extraout_var,iVar6);
            }
            size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
            _vptr_BaseSignatureChecker =
                 size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
                 _vptr_BaseSignatureChecker + lVar23;
            new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_payload._M_value =
                 GetMinimumFeeRate(this_01,&new_coin_control,(FeeCalculation *)0x0);
            if ((long)new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>.
                      _M_payload.super__Optional_payload_base<CFeeRate>._M_payload <
                (long)size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
                      _vptr_BaseSignatureChecker) {
              new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_payload =
                   (_Storage<CFeeRate,_true>)
                   size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
                   _vptr_BaseSignatureChecker;
            }
            if (new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                super__Optional_payload_base<CFeeRate>._M_engaged == false) {
              new_coin_control.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged = true;
            }
          }
          RVar5 = WALLET_ERROR;
          puVar20 = *(undefined8 **)
                     ((long)&((_Var8._M_cur)->
                             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                             ._M_storage._M_storage + 0x1b8);
          puVar2 = (undefined8 *)puVar20[1];
          for (puVar20 = (undefined8 *)*puVar20; puVar20 != puVar2; puVar20 = puVar20 + 0xd) {
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _32_4_ = *(undefined4 *)(puVar20 + 4);
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_
                 = *puVar20;
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_
                 = puVar20[1];
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _16_8_ = puVar20[2];
            res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
            _24_8_ = puVar20[3];
            CCoinControl::Select(&new_coin_control,(COutPoint *)&res);
          }
          new_coin_control.m_allow_other_inputs = true;
          new_coin_control.m_min_depth = 1;
          CreateTransaction(&res,this_01,&recipients,(optional<unsigned_int>)0x0,&new_coin_control,
                            false);
          if (res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index
              == '\x01') {
            pTVar19 = util::Result<wallet::CreatedTransactionResult>::value(&res);
            *new_fee = pTVar19->fee;
            CMutableTransaction::CMutableTransaction
                      ((CMutableTransaction *)&size_checker,
                       (pTVar19->tx).
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            CMutableTransaction::operator=(mtx,(CMutableTransaction *)&size_checker);
            CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&size_checker);
            RVar5 = OK;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_648,"Unable to create transaction.",
                       (allocator<char> *)(local_78 + 0x20));
            original_08._M_string_length = (size_type)this_01;
            original_08._M_dataplus._M_p = (pointer)errors;
            original_08.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
            original_08.field_2._8_8_ = uVar15;
            Untranslated(&local_628,original_08);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_6a8," ",(allocator<char> *)local_78);
            original_09._M_string_length = (size_type)this_01;
            original_09._M_dataplus._M_p = (pointer)errors;
            original_09.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
            original_09.field_2._8_8_ = uVar15;
            Untranslated((bilingual_str *)&weights,original_09);
            lhs.original._M_string_length = (size_type)this_01;
            lhs.original._M_dataplus._M_p = (pointer)errors;
            lhs.original.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
            lhs.original.field_2._8_8_ = uVar15;
            lhs.translated._M_dataplus._M_p = (pointer)old_fee;
            lhs.translated._M_string_length = lVar26;
            lhs.translated.field_2._M_allocated_capacity = (size_type)new_fee;
            lhs.translated.field_2._8_8_ = wtx;
            ::operator+(&local_5e8,lhs,&local_628);
            util::ErrorString<wallet::CreatedTransactionResult>(&local_6e8,&res);
            lhs_00.original._M_string_length = (size_type)this_01;
            lhs_00.original._M_dataplus._M_p = (pointer)errors;
            lhs_00.original.field_2._M_allocated_capacity = (size_type)_Var8._M_cur;
            lhs_00.original.field_2._8_8_ = uVar15;
            lhs_00.translated._M_dataplus._M_p = (pointer)old_fee;
            lhs_00.translated._M_string_length = lVar26;
            lhs_00.translated.field_2._M_allocated_capacity = (size_type)new_fee;
            lhs_00.translated.field_2._8_8_ = wtx;
            ::operator+((bilingual_str *)&size_checker,lhs_00,&local_5e8);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (errors,(bilingual_str *)&size_checker);
            bilingual_str::~bilingual_str((bilingual_str *)&size_checker);
            bilingual_str::~bilingual_str(&local_6e8);
            bilingual_str::~bilingual_str(&local_5e8);
            bilingual_str::~bilingual_str((bilingual_str *)&weights);
            std::__cxx11::string::~string(local_6a8);
            bilingual_str::~bilingual_str(&local_628);
            std::__cxx11::string::~string(local_648);
          }
          _GLOBAL__N_1::std::__detail::__variant::
          _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
                             *)&res);
        }
LAB_004a538a:
        std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector(&recipients);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
LAB_004a53a1:
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&spent_outputs);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&coins._M_t);
    }
LAB_004a53bb:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    CCoinControl::~CCoinControl(&new_coin_control);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_f8,
               "The options \'outputs\' and \'original_change_index\' are incompatible. You can only either specify a new set of outputs, or designate a change output to be recycled."
               ,(allocator<char> *)&txdata);
    original._M_string_length = (size_type)wallet;
    original._M_dataplus._M_p = (pointer)errors;
    original.field_2._M_allocated_capacity = in_stack_fffffffffffff848;
    original.field_2._8_8_ = in_stack_fffffffffffff850;
    Untranslated((bilingual_str *)&new_coin_control,original);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,(bilingual_str *)&new_coin_control);
    RVar5 = INVALID_PARAMETER;
    bilingual_str::~bilingual_str((bilingual_str *)&new_coin_control);
    std::__cxx11::string::~string(local_f8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar5;
  }
LAB_004a5ab4:
  __stack_chk_fail();
}

Assistant:

Result CreateRateBumpTransaction(CWallet& wallet, const uint256& txid, const CCoinControl& coin_control, std::vector<bilingual_str>& errors,
                                 CAmount& old_fee, CAmount& new_fee, CMutableTransaction& mtx, bool require_mine, const std::vector<CTxOut>& outputs, std::optional<uint32_t> original_change_index)
{
    // For now, cannot specify both new outputs to use and an output index to send change
    if (!outputs.empty() && original_change_index.has_value()) {
        errors.push_back(Untranslated("The options 'outputs' and 'original_change_index' are incompatible. You can only either specify a new set of outputs, or designate a change output to be recycled."));
        return Result::INVALID_PARAMETER;
    }

    // We are going to modify coin control later, copy to reuse
    CCoinControl new_coin_control(coin_control);

    LOCK(wallet.cs_wallet);
    errors.clear();
    auto it = wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::INVALID_ADDRESS_OR_KEY;
    }
    const CWalletTx& wtx = it->second;

    // Make sure that original_change_index is valid
    if (original_change_index.has_value() && original_change_index.value() >= wtx.tx->vout.size()) {
        errors.push_back(Untranslated("Change position is out of range"));
        return Result::INVALID_PARAMETER;
    }

    // Retrieve all of the UTXOs and add them to coin control
    // While we're here, calculate the input amount
    std::map<COutPoint, Coin> coins;
    CAmount input_value = 0;
    std::vector<CTxOut> spent_outputs;
    for (const CTxIn& txin : wtx.tx->vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    wallet.chain().findCoins(coins);
    for (const CTxIn& txin : wtx.tx->vin) {
        const Coin& coin = coins.at(txin.prevout);
        if (coin.out.IsNull()) {
            errors.push_back(Untranslated(strprintf("%s:%u is already spent", txin.prevout.hash.GetHex(), txin.prevout.n)));
            return Result::MISC_ERROR;
        }
        PreselectedInput& preset_txin = new_coin_control.Select(txin.prevout);
        if (!wallet.IsMine(txin.prevout)) {
            preset_txin.SetTxOut(coin.out);
        }
        input_value += coin.out.nValue;
        spent_outputs.push_back(coin.out);
    }

    // Figure out if we need to compute the input weight, and do so if necessary
    PrecomputedTransactionData txdata;
    txdata.Init(*wtx.tx, std::move(spent_outputs), /* force=*/ true);
    for (unsigned int i = 0; i < wtx.tx->vin.size(); ++i) {
        const CTxIn& txin = wtx.tx->vin.at(i);
        const Coin& coin = coins.at(txin.prevout);

        if (new_coin_control.IsExternalSelected(txin.prevout)) {
            // For external inputs, we estimate the size using the size of this input
            int64_t input_weight = GetTransactionInputWeight(txin);
            // Because signatures can have different sizes, we need to figure out all of the
            // signature sizes and replace them with the max sized signature.
            // In order to do this, we verify the script with a special SignatureChecker which
            // will observe the signatures verified and record their sizes.
            SignatureWeights weights;
            TransactionSignatureChecker tx_checker(wtx.tx.get(), i, coin.out.nValue, txdata, MissingDataBehavior::FAIL);
            SignatureWeightChecker size_checker(weights, tx_checker);
            VerifyScript(txin.scriptSig, coin.out.scriptPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
            // Add the difference between max and current to input_weight so that it represents the largest the input could be
            input_weight += weights.GetWeightDiffToMax();
            new_coin_control.SetInputWeight(txin.prevout, input_weight);
        }
    }

    Result result = PreconditionChecks(wallet, wtx, require_mine, errors);
    if (result != Result::OK) {
        return result;
    }

    // Calculate the old output amount.
    CAmount output_value = 0;
    for (const auto& old_output : wtx.tx->vout) {
        output_value += old_output.nValue;
    }

    old_fee = input_value - output_value;

    // Fill in recipients (and preserve a single change key if there
    // is one). If outputs vector is non-empty, replace original
    // outputs with its contents, otherwise use original outputs.
    std::vector<CRecipient> recipients;
    CAmount new_outputs_value = 0;
    const auto& txouts = outputs.empty() ? wtx.tx->vout : outputs;
    for (size_t i = 0; i < txouts.size(); ++i) {
        const CTxOut& output = txouts.at(i);
        CTxDestination dest;
        ExtractDestination(output.scriptPubKey, dest);
        if (original_change_index.has_value() ?  original_change_index.value() == i : OutputIsChange(wallet, output)) {
            new_coin_control.destChange = dest;
        } else {
            CRecipient recipient = {dest, output.nValue, false};
            recipients.push_back(recipient);
        }
        new_outputs_value += output.nValue;
    }

    // If no recipients, means that we are sending coins to a change address
    if (recipients.empty()) {
        // Just as a sanity check, ensure that the change address exist
        if (std::get_if<CNoDestination>(&new_coin_control.destChange)) {
            errors.emplace_back(Untranslated("Unable to create transaction. Transaction must have at least one recipient"));
            return Result::INVALID_PARAMETER;
        }

        // Add change as recipient with SFFO flag enabled, so fees are deduced from it.
        // If the output differs from the original tx output (because the user customized it) a new change output will be created.
        recipients.emplace_back(CRecipient{new_coin_control.destChange, new_outputs_value, /*fSubtractFeeFromAmount=*/true});
        new_coin_control.destChange = CNoDestination();
    }

    if (coin_control.m_feerate) {
        // The user provided a feeRate argument.
        // We calculate this here to avoid compiler warning on the cs_wallet lock
        // We need to make a temporary transaction with no input witnesses as the dummy signer expects them to be empty for external inputs
        CMutableTransaction temp_mtx{*wtx.tx};
        for (auto& txin : temp_mtx.vin) {
            txin.scriptSig.clear();
            txin.scriptWitness.SetNull();
        }
        temp_mtx.vout = txouts;
        const int64_t maxTxSize{CalculateMaximumSignedTxSize(CTransaction(temp_mtx), &wallet, &new_coin_control).vsize};
        Result res = CheckFeeRate(wallet, temp_mtx, *new_coin_control.m_feerate, maxTxSize, old_fee, errors);
        if (res != Result::OK) {
            return res;
        }
    } else {
        // The user did not provide a feeRate argument
        new_coin_control.m_feerate = EstimateFeeRate(wallet, wtx, old_fee, new_coin_control);
    }

    // Fill in required inputs we are double-spending(all of them)
    // N.B.: bip125 doesn't require all the inputs in the replaced transaction to be
    // used in the replacement transaction, but it's very important for wallets to make
    // sure that happens. If not, it would be possible to bump a transaction A twice to
    // A2 and A3 where A2 and A3 don't conflict (or alternatively bump A to A2 and A2
    // to A3 where A and A3 don't conflict). If both later get confirmed then the sender
    // has accidentally double paid.
    for (const auto& inputs : wtx.tx->vin) {
        new_coin_control.Select(COutPoint(inputs.prevout));
    }
    new_coin_control.m_allow_other_inputs = true;

    // We cannot source new unconfirmed inputs(bip125 rule 2)
    new_coin_control.m_min_depth = 1;

    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, new_coin_control, false);
    if (!res) {
        errors.push_back(Untranslated("Unable to create transaction.") + Untranslated(" ") + util::ErrorString(res));
        return Result::WALLET_ERROR;
    }

    const auto& txr = *res;
    // Write back new fee if successful
    new_fee = txr.fee;

    // Write back transaction
    mtx = CMutableTransaction(*txr.tx);

    return Result::OK;
}